

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O3

bool __thiscall create::Create::setAllMotors(Create *this,float *main,float *side,float *vacuum)

{
  undefined1 uVar1;
  ProtocolVersion PVar2;
  ssize_t sVar3;
  byte bVar4;
  undefined7 uVar5;
  void *__buf;
  int __fd;
  element_type *this_00;
  int in_R8D;
  float fVar6;
  uint8_t cmd_1 [2];
  uint8_t cmd [4];
  undefined1 local_4e;
  byte local_4d;
  undefined1 local_4c;
  uint8_t local_4b;
  uint8_t local_4a;
  uint8_t local_49;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  bVar4 = (byte)vacuum;
  uVar5 = (undefined7)((ulong)vacuum >> 8);
  if (((1.0 < ABS(*main)) || (1.0 < ABS(*side))) || (1.0 < ABS(*vacuum))) {
    uVar1 = 0;
  }
  else {
    local_38 = ZEXT416((uint)*vacuum);
    local_48 = ZEXT416((uint)*side);
    fVar6 = roundf(*main * 127.0);
    this->mainMotorPower = (uint8_t)(int)fVar6;
    fVar6 = roundf((float)local_48._0_4_ * 127.0);
    this->sideMotorPower = (uint8_t)(int)fVar6;
    fVar6 = roundf((float)local_38._0_4_ * 127.0);
    this->vacuumMotorPower = (uint8_t)(int)fVar6;
    PVar2 = RobotModel::getVersion(&this->model);
    if (PVar2 == V_1) {
      __fd = (int)&local_4e;
      local_4e = 0x8a;
      bVar4 = (*main != 0.0) << 2 | (*vacuum != 0.0) * '\x02' | *side != 0.0;
      this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      __buf = (void *)0x2;
      local_4d = bVar4;
    }
    else {
      __fd = (int)&local_4c;
      local_4c = 0x90;
      local_4b = this->mainMotorPower;
      local_4a = this->sideMotorPower;
      local_49 = this->vacuumMotorPower;
      this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      __buf = (void *)0x4;
    }
    sVar3 = Serial::send(this_00,__fd,__buf,CONCAT71(uVar5,bVar4),in_R8D);
    uVar1 = (undefined1)sVar3;
  }
  return (bool)uVar1;
}

Assistant:

bool Create::setAllMotors(const float& main, const float& side, const float& vacuum) {
    if (main < -1.0 || main > 1.0 ||
        side < -1.0 || side > 1.0 ||
        vacuum < -1.0 || vacuum > 1.0)
      return false;

    mainMotorPower = roundf(main * 127);
    sideMotorPower = roundf(side * 127);
    vacuumMotorPower = roundf(vacuum * 127);

    if (model.getVersion() == V_1) {
        uint8_t cmd[2] = { OC_MOTORS,
                           static_cast<uint8_t>((side != 0.0 ? 1 : 0) |
                                     (vacuum != 0.0 ? 2 : 0) |
                                     (main != 0.0 ? 4 : 0))
                         };
        return serial->send(cmd, 2);
    }

    uint8_t cmd[4] = { OC_MOTORS_PWM,
                       mainMotorPower,
                       sideMotorPower,
                       vacuumMotorPower
                     };

    return serial->send(cmd, 4);
  }